

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O1

int GaussPlane_F32(float *src,int src_stride,float *dst,int dst_stride,int width,int height)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  float *pfVar3;
  void *__ptr;
  float *src4;
  int iVar4;
  int iVar5;
  undefined8 *puVar6;
  int iVar7;
  float *src1;
  float *src0;
  float *src3;
  float *src2;
  ulong uVar8;
  int local_80;
  
  uVar8 = (ulong)(uint)width;
  iVar4 = -1;
  if ((height != 0 && 0 < width) && (dst != (float *)0x0 && src != (float *)0x0)) {
    local_80 = src_stride;
    if (height < 0) {
      src = src + ~height * src_stride;
      local_80 = -src_stride;
      height = -height;
    }
    __ptr = malloc((ulong)(width * 4 + 0x5f));
    puVar6 = (undefined8 *)((long)__ptr + 0x3fU & 0xffffffffffffffc0);
    *puVar6 = 0;
    puVar6[1] = 0;
    puVar1 = (undefined8 *)((long)puVar6 + (ulong)(width * 4 + 0x10));
    *puVar1 = 0;
    puVar1[1] = 0;
    if (0 < height) {
      iVar4 = local_80;
      if (height == 1) {
        iVar4 = 0;
      }
      iVar5 = 0;
      if (2 < height) {
        iVar5 = local_80;
      }
      iVar7 = 2;
      pfVar3 = src + iVar4 + iVar5;
      src0 = src;
      src4 = src + iVar4;
      src2 = src;
      do {
        src3 = src4;
        src1 = src;
        src4 = pfVar3;
        GaussCol_F32_C(src0,src1,src2,src3,src4,(float *)(puVar6 + 2),width);
        *(undefined4 *)((long)puVar6 + 0xc) = *(undefined4 *)(puVar6 + 2);
        *(undefined4 *)(puVar6 + 1) = *(undefined4 *)(puVar6 + 2);
        uVar2 = *(undefined4 *)((long)puVar6 + uVar8 * 4 + 0xc);
        *(undefined4 *)((long)puVar6 + uVar8 * 4 + 0x10) = uVar2;
        *(undefined4 *)((long)puVar6 + uVar8 * 4 + 0x14) = uVar2;
        GaussRow_F32_C((float *)(puVar6 + 1),dst,width);
        iVar4 = 0;
        if (iVar7 < height + -1) {
          iVar4 = local_80;
        }
        dst = dst + dst_stride;
        iVar5 = iVar7 - height;
        iVar7 = iVar7 + 1;
        pfVar3 = src4 + iVar4;
        src = src2;
        src0 = src1;
        src2 = src3;
      } while (iVar5 != 1);
    }
    free(__ptr);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

LIBYUV_API
int GaussPlane_F32(const float* src,
                   int src_stride,
                   float* dst,
                   int dst_stride,
                   int width,
                   int height) {
  int y;
  void (*GaussCol_F32)(const float* src0, const float* src1, const float* src2,
                       const float* src3, const float* src4, float* dst,
                       int width) = GaussCol_F32_C;
  void (*GaussRow_F32)(const float* src, float* dst, int width) =
      GaussRow_F32_C;
  if (!src || !dst || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src = src + (height - 1) * src_stride;
    src_stride = -src_stride;
  }

#if defined(HAS_GAUSSCOL_F32_NEON)
  if (TestCpuFlag(kCpuHasNEON) && IS_ALIGNED(width, 8)) {
    GaussCol_F32 = GaussCol_F32_NEON;
  }
#endif
#if defined(HAS_GAUSSROW_F32_NEON)
  if (TestCpuFlag(kCpuHasNEON) && IS_ALIGNED(width, 8)) {
    GaussRow_F32 = GaussRow_F32_NEON;
  }
#endif
  {
    // 2 pixels on each side, but aligned out to 16 bytes.
    align_buffer_64(rowbuf, (4 + width + 4) * 4);
    memset(rowbuf, 0, 16);
    memset(rowbuf + (4 + width) * 4, 0, 16);
    float* row = (float*)(rowbuf + 16);
    const float* src0 = src;
    const float* src1 = src;
    const float* src2 = src;
    const float* src3 = src2 + ((height > 1) ? src_stride : 0);
    const float* src4 = src3 + ((height > 2) ? src_stride : 0);

    for (y = 0; y < height; ++y) {
      GaussCol_F32(src0, src1, src2, src3, src4, row, width);

      // Extrude edge by 2 floats
      row[-2] = row[-1] = row[0];
      row[width + 1] = row[width] = row[width - 1];

      GaussRow_F32(row - 2, dst, width);

      src0 = src1;
      src1 = src2;
      src2 = src3;
      src3 = src4;
      if ((y + 2) < (height - 1)) {
        src4 += src_stride;
      }
      dst += dst_stride;
    }
    free_aligned_buffer_64(rowbuf);
  }
  return 0;
}